

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O1

_Bool find_empty_range(chunk_conflict *c,loc_conflict *grid,loc_conflict top_left,
                      loc_conflict bottom_right)

{
  loc grid_00;
  _Bool _Var1;
  _Bool _Var2;
  int *state;
  
  state = cave_find_init(top_left,bottom_right);
  _Var1 = cave_find_get_grid(grid,state);
  if (_Var1) {
    do {
      grid_00.x = grid->x;
      grid_00.y = grid->y;
      _Var1 = square_isempty(c,grid_00);
      if (_Var1) break;
      _Var2 = cave_find_get_grid(grid,state);
    } while (_Var2);
  }
  else {
    _Var1 = false;
  }
  mem_free(state);
  return _Var1;
}

Assistant:

bool find_empty_range(struct chunk *c, struct loc *grid, struct loc top_left,
	struct loc bottom_right)
{
	return cave_find_in_range(c, grid, top_left, bottom_right,
		square_isempty);
}